

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void google::protobuf::compiler::protobuf_google_2fprotobuf_2fcompiler_2fplugin_2eproto::
     anon_unknown_5::protobuf_AssignDescriptors(void)

{
  allocator<char> local_31;
  string local_30;
  MessageFactory *local_10;
  MessageFactory *factory;
  
  AddDescriptors();
  local_10 = (MessageFactory *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"google/protobuf/compiler/plugin.proto",&local_31);
  internal::AssignDescriptors
            (&local_30,(MigrationSchema *)schemas,(Message **)file_default_instances,
             (uint32 *)TableStruct::offsets,local_10,
             (Metadata *)&(anonymous_namespace)::file_level_metadata,(EnumDescriptor **)0x0,
             (ServiceDescriptor **)0x0);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void protobuf_AssignDescriptors() {
  AddDescriptors();
  ::google::protobuf::MessageFactory* factory = NULL;
  AssignDescriptors(
      "google/protobuf/compiler/plugin.proto", schemas, file_default_instances, TableStruct::offsets, factory,
      file_level_metadata, NULL, NULL);
}